

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O2

void __thiscall
Clasp::DefaultMinimize::reason(DefaultMinimize *this,Solver *s,Literal p,LitVec *lits)

{
  ulong uVar1;
  ulong uVar2;
  Literal x;
  Literal local_2c;
  
  uVar1 = 0xffffffff;
  if (p.rep_ >> 2 < (s->assign_).reason_.data_.ebo_.size) {
    uVar1 = (ulong)(s->assign_).reason_.data_.ebo_.buf[p.rep_ >> 2];
  }
  local_2c.rep_ = (s->shared_->step_).rep_;
  if ((3 < local_2c.rep_) &&
     ((byte)(*(byte *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(local_2c.rep_ & 0xfffffffc)) &
            3) == (byte)(2U - ((local_2c.rep_ & 2) == 0)))) {
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back(lits,&local_2c);
  }
  if (0xf < *(uint *)((long)(s->assign_).assign_.ebo_.buf +
                     (ulong)((this->super_MinimizeConstraint).tag_.rep_ & 0xfffffffc))) {
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back
              (lits,&(this->super_MinimizeConstraint).tag_);
  }
  for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    local_2c.rep_ =
         *(uint32 *)
          (&(((SharedData *)((this->super_MinimizeConstraint).shared_[1].up_ + -1))->adjust_).ebo_.
            buf + (this->undo_[uVar2].rep & 0x3fffffff));
    bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::push_back(lits,&local_2c);
  }
  return;
}

Assistant:

void DefaultMinimize::reason(Solver& s, Literal p, LitVec& lits) {
	assert(s.isTrue(tag_));
	uint32 stop = s.reasonData(p);
	Literal   x = s.sharedContext()->stepLiteral();
	assert(stop <= undoTop_);
	if (!isSentinel(x) && s.isTrue(x)) { lits.push_back(x); }
	if (s.level(tag_.var()))           { lits.push_back(tag_); }
	for (uint32 i = 0; i != stop; ++i) {
		UndoInfo u = undo_[i];
		x = shared_->lits[u.index()].first;
		lits.push_back(x);
	}
}